

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O0

void __thiscall nested_runs::C::run(C *this)

{
  FlowBuilder *__stat_loc;
  FlowBuilder *in_RDI;
  Task C2;
  Task C1;
  Task *tasks;
  Future<void> *this_00;
  Taskflow *f;
  Executor *in_stack_ffffffffffffffa8;
  undefined1 local_48 [24];
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  Task local_10 [2];
  
  tf::Taskflow::clear((Taskflow *)0x126f08);
  tasks = local_10;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_basics_cpp:948:34),_nullptr>
            ((FlowBuilder *)in_stack_ffffffffffffffd8,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffd0);
  this_00 = (Future<void> *)&stack0xffffffffffffffe0;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_basics_cpp:949:34),_nullptr>
            (in_RDI,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffd0);
  tf::Task::precede<tf::Task&>((Task *)this_00,tasks);
  __stat_loc = in_RDI + 0x19;
  f = (Taskflow *)local_48;
  tf::Executor::run_n(in_stack_ffffffffffffffa8,f,(size_t)in_RDI);
  std::__basic_future<void>::wait((__basic_future<void> *)f,__stat_loc);
  tf::Future<void>::~Future(this_00);
  return;
}

Assistant:

void run()
    {
      taskflow.clear();
      auto C1 = taskflow.emplace([&] () { ++counter; });
      auto C2 = taskflow.emplace([&] () { ++counter; b_sim.run(); });
      C1.precede(C2);
      executor.run_n(taskflow, 100).wait();
    }